

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypePrimitiveReader.cpp
# Opt level: O0

EStatusCode __thiscall
OpenTypePrimitiveReader::ReadLongDateTime(OpenTypePrimitiveReader *this,longlong *outValue)

{
  EStatusCode EVar1;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  Byte byte8;
  Byte byte7;
  Byte byte6;
  Byte byte5;
  Byte byte4;
  Byte byte3;
  Byte byte2;
  Byte byte1;
  longlong *outValue_local;
  OpenTypePrimitiveReader *this_local;
  
  _byte8 = outValue;
  outValue_local = (longlong *)this;
  EVar1 = ReadBYTE(this,&local_21);
  if (EVar1 == eSuccess) {
    EVar1 = ReadBYTE(this,&local_22);
    if (EVar1 == eSuccess) {
      EVar1 = ReadBYTE(this,&local_23);
      if (EVar1 == eSuccess) {
        EVar1 = ReadBYTE(this,&local_24);
        if (EVar1 == eSuccess) {
          EVar1 = ReadBYTE(this,&local_25);
          if (EVar1 == eSuccess) {
            EVar1 = ReadBYTE(this,&local_26);
            if (EVar1 == eSuccess) {
              EVar1 = ReadBYTE(this,&local_27);
              if (EVar1 == eSuccess) {
                EVar1 = ReadBYTE(this,&local_28);
                if (EVar1 == eSuccess) {
                  *_byte8 = ((ulong)local_21 << 0x38) + ((ulong)local_22 << 0x30) +
                            ((ulong)local_23 << 0x28) + ((ulong)local_24 << 0x20) +
                            (ulong)local_25 * 0x1000000 + (ulong)local_26 * 0x10000 +
                            (ulong)local_27 * 0x100 + (ulong)local_28;
                  this_local._4_4_ = eSuccess;
                }
                else {
                  this_local._4_4_ = eFailure;
                }
              }
              else {
                this_local._4_4_ = eFailure;
              }
            }
            else {
              this_local._4_4_ = eFailure;
            }
          }
          else {
            this_local._4_4_ = eFailure;
          }
        }
        else {
          this_local._4_4_ = eFailure;
        }
      }
      else {
        this_local._4_4_ = eFailure;
      }
    }
    else {
      this_local._4_4_ = eFailure;
    }
  }
  else {
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode OpenTypePrimitiveReader::ReadLongDateTime(long long& outValue)
{
	Byte byte1,byte2,byte3,byte4,byte5,byte6,byte7,byte8;

	if(ReadBYTE(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte3) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte4) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte5) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte6) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte7) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte8) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	outValue =(long long)(	((unsigned long long)byte1 << 56) + ((unsigned long long)byte2 << 48) + 
							((unsigned long long)byte3 << 40) + ((unsigned long long)byte4 << 32) + 
							((unsigned long long)byte5 << 24) + ((unsigned long long)byte6 << 16) + 
							((unsigned long long)byte7 << 8) + byte8);
	return PDFHummus::eSuccess;	
}